

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

bool IsConsoleWindow(void)

{
  return true;
}

Assistant:

bool IsConsoleWindow()
{
#ifdef _WIN32
    DWORD dwProcessId{};
    return GetConsoleProcessList(&dwProcessId, 1) > 1;
#else
    return true;
#endif
}